

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

void Ver_ParseRemoveSuffixTable(Ver_Man_t *pMan)

{
  int iVar1;
  st__generator *gen;
  char *pKey;
  char *pValue;
  char *local_30;
  char *local_28;
  
  if (pMan->tName2Suffix != (st__table *)0x0) {
    gen = st__init_gen(pMan->tName2Suffix);
    iVar1 = st__gen(gen,&local_30,&local_28);
    if (iVar1 != 0) {
      do {
        if (local_30 != (char *)0x0) {
          free(local_30);
          local_30 = (char *)0x0;
        }
        iVar1 = st__gen(gen,&local_30,&local_28);
      } while (iVar1 != 0);
    }
    st__free_gen(gen);
    st__free_table(pMan->tName2Suffix);
    pMan->tName2Suffix = (st__table *)0x0;
  }
  return;
}

Assistant:

void Ver_ParseRemoveSuffixTable( Ver_Man_t * pMan )
{
    st__generator * gen;
    char * pKey, * pValue;
    if ( pMan->tName2Suffix == NULL )
        return;
    st__foreach_item( pMan->tName2Suffix, gen, (const char **)&pKey, (char **)&pValue )
        ABC_FREE( pKey );
    st__free_table( pMan->tName2Suffix );
    pMan->tName2Suffix = NULL;
}